

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TypeParameterDeclarationSyntax *pTVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000108;
  SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  Token *args_1;
  
  args_1 = (Token *)__child_stack;
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  if (((Token *)((long)__fn + 0x30))->info != (Info *)0x0) {
    deepClone<slang::syntax::ForwardTypeRestrictionSyntax>
              ((ForwardTypeRestrictionSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  }
  deepClone<slang::syntax::TypeAssignmentSyntax>(in_stack_00000110,in_stack_00000108);
  pTVar1 = BumpAllocator::
           emplace<slang::syntax::TypeParameterDeclarationSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ForwardTypeRestrictionSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>&>
                     (unaff_retaddr,(Token *)__fn,args_1,(ForwardTypeRestrictionSyntax **)TVar2.info
                      ,TVar2._0_8_);
  return (int)pTVar1;
}

Assistant:

static SyntaxNode* clone(const TypeParameterDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<TypeParameterDeclarationSyntax>(
        node.keyword.deepClone(alloc),
        node.typeKeyword.deepClone(alloc),
        node.typeRestriction ? deepClone(*node.typeRestriction, alloc) : nullptr,
        *deepClone(node.declarators, alloc)
    );
}